

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O2

void ObjectTemp::SetDstIsTemp
               (bool dstIsTemp,bool dstIsTempTransferred,Instr *instr,BackwardPass *backwardPass)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if (dstIsTempTransferred && !dstIsTemp) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/TempTracker.cpp"
                       ,0x4b1,"(dstIsTemp || !dstIsTempTransferred)",
                       "dstIsTemp || !dstIsTempTransferred");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  if (instr->m_opcode != ArgOut_A) {
    *(ushort *)&instr->field_0x36 = (*(ushort *)&instr->field_0x36 & 0xfff7) + (ushort)dstIsTemp * 8
    ;
    if (backwardPass->currentPrePassLoop == (Loop *)0x0) {
      bVar2 = OpCodeAttr::TempObjectProducing(instr->m_opcode);
      if (bVar2) {
        backwardPass->func->hasMarkTempObjects = true;
        backwardPass->numMarkTempObject = backwardPass->numMarkTempObject + (uint)dstIsTemp;
      }
    }
  }
  return;
}

Assistant:

void
ObjectTemp::SetDstIsTemp(bool dstIsTemp, bool dstIsTempTransferred, IR::Instr * instr, BackwardPass * backwardPass)
{
    Assert(dstIsTemp || !dstIsTempTransferred);

    // ArgOut_A are marked by CallDirect and don't need to be set
    if (instr->m_opcode == Js::OpCode::ArgOut_A)
    {
        return;
    }
    instr->dstIsTempObject = dstIsTemp;

    if (!backwardPass->IsPrePass())
    {
        if (OpCodeAttr::TempObjectProducing(instr->m_opcode))
        {
            backwardPass->func->SetHasMarkTempObjects();
#if DBG_DUMP
            backwardPass->numMarkTempObject += dstIsTemp;
#endif
        }
    }
}